

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_schnorrsig_sign_internal
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  size_t msglen_00;
  secp256k1_scalar sVar4;
  char cVar5;
  int i;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uchar *msg_00;
  uchar *p;
  secp256k1_gej *r_00;
  uint uVar10;
  secp256k1_context *ctx_00;
  secp256k1_keypair *r_01;
  code *pcVar11;
  undefined1 auVar12 [16];
  undefined1 local_220 [8];
  int vflag;
  uint local_214;
  size_t local_210;
  uchar *local_208;
  secp256k1_scalar e;
  uchar buf [32];
  uchar pk_buf [32];
  secp256k1_ge r;
  secp256k1_ge pk;
  secp256k1_callback local_e8;
  undefined1 local_d8 [12];
  uint uStack_cc;
  secp256k1_gej rj;
  
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_8();
LAB_0010e647:
    secp256k1_schnorrsig_sign_internal_cold_7();
    return 0;
  }
  if ((ctx->ecmult_gen_ctx).built == 0) goto LAB_0010e647;
  if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_6();
    return 0;
  }
  if (msglen != 0 && msg == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_5();
    return 0;
  }
  if (keypair == (secp256k1_keypair *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_4();
    return 0;
  }
  pcVar11 = nonce_function_bip340;
  if (noncefp != (secp256k1_nonce_function_hardened)0x0) {
    pcVar11 = noncefp;
  }
  r_00 = (secp256k1_gej *)local_220;
  r_01 = keypair;
  local_208 = msg;
  uVar6 = secp256k1_keypair_load(ctx,(secp256k1_scalar *)r_00,&pk,keypair);
  secp256k1_fe_verify(&pk.y);
  if (pk.y.normalized == 0) {
    secp256k1_schnorrsig_sign_internal_cold_3();
  }
  else {
    local_210 = msglen;
    if (((byte)pk.y.n[0] & 1) != 0) {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)local_220._0_4_);
      uVar10 = 0xd - local_220._0_4_;
      if (local_220._0_4_ == 0) {
        uVar10 = 0;
      }
      local_220._0_4_ = uVar10;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar10);
    }
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)local_220._0_4_);
    local_e8.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_e8.data = (void *)0x0;
    local_d8 = SUB1612((undefined1  [16])0x0,0);
    uStack_cc = (uint)local_220._0_4_ >> 0x18 | (local_220._0_4_ & 0xff0000) >> 8 |
                (local_220._0_4_ & 0xff00) << 8 | local_220._0_4_ << 0x18;
    r_01 = (secp256k1_keypair *)pk_buf;
    secp256k1_fe_get_b32((uchar *)r_01,&pk.x);
    iVar7 = (*pcVar11)(buf,local_208,local_210,(uchar *)&local_e8,(uchar *)r_01,"BIP0340/nonce",0xd,
                       ndata);
    lVar8 = 0;
    uVar10 = 0;
    do {
      uVar9 = (uint)buf[lVar8] | uVar10 << 8;
      uVar10 = uVar9 - (uVar9 / 0xd + (uVar9 / 0xd) * 0xc);
      if (uVar9 < 0xd) {
        uVar10 = uVar9;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x20);
    local_220._4_4_ = uVar10;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar10);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar10);
    local_214 = uVar6;
    if (iVar7 == 0) {
      local_214 = 0;
    }
    if (uVar10 == 0) {
      local_214 = 0;
    }
    uVar6 = local_214 ^ 1;
    rj.x.n[0] = 0x4d430005;
    rj.x.n[2] = 4;
    keypair = (secp256k1_keypair *)0x0;
    rj.x.n[3] = 0;
    rj.x.n[4] = 0;
    rj.x.magnitude = 0;
    rj.x.normalized = 0;
    r.x.n[0] = 0;
    local_220._4_4_ = uVar6 & 1 | uVar6 - 1 & local_220._4_4_;
    vflag = uVar6;
    rj.x.n[1] = (uint64_t)(local_220 + 4);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)local_220._4_4_);
    r_00 = &rj;
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,r_00,(secp256k1_scalar *)(local_220 + 4));
    secp256k1_ge_set_gej(&r,r_00);
    if (ctx->declassify == 0) goto LAB_0010e501;
  }
  secp256k1_schnorrsig_sign_internal_cold_1();
LAB_0010e501:
  ctx_00 = (secp256k1_context *)&r.y;
  secp256k1_fe_normalize_var((secp256k1_fe *)ctx_00);
  secp256k1_fe_verify((secp256k1_fe *)ctx_00);
  msglen_00 = local_210;
  if (r.y.normalized == 0) {
    secp256k1_schnorrsig_sign_internal_cold_2();
    iVar7 = secp256k1_schnorrsig_sign_internal
                      (ctx_00,(uchar *)r_00,msg_00,0x20,keypair,nonce_function_bip340,r_01);
    return iVar7;
  }
  if (((byte)r.y.n[0] & 1) != 0) {
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)local_220._4_4_);
    uVar10 = 0xd - local_220._4_4_;
    if (local_220._4_4_ == 0) {
      uVar10 = 0;
    }
    local_220._4_4_ = uVar10;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar10);
  }
  secp256k1_fe_normalize_var(&r.x);
  secp256k1_fe_get_b32(sig64,&r.x);
  secp256k1_schnorrsig_challenge(&e,sig64,local_208,msglen_00,pk_buf);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)e);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)local_220._0_4_);
  uVar10 = e * local_220._0_4_;
  e = uVar10 - (uVar10 / 0xd + (uVar10 / 0xd) * 0xc);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)e);
  secp256k1_scalar_add(&e,&e,(secp256k1_scalar *)(local_220 + 4));
  sVar4 = e;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)e);
  *(undefined1 (*) [16])(sig64 + 0x2c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(sig64 + 0x20) = (undefined1  [16])0x0;
  *(secp256k1_scalar *)(sig64 + 0x3c) =
       sVar4 >> 0x18 | (sVar4 & 0xff0000) >> 8 | (sVar4 & 0xff00) << 8 | sVar4 << 0x18;
  cVar5 = (char)uVar6 + -1;
  auVar12 = ZEXT216(CONCAT11(cVar5,cVar5));
  auVar12 = pshuflw(auVar12,auVar12,0);
  uVar6 = auVar12._0_4_;
  lVar8 = 0;
  do {
    puVar1 = (uint *)(sig64 + lVar8);
    uVar10 = puVar1[1];
    uVar9 = puVar1[2];
    uVar3 = puVar1[3];
    puVar2 = (uint *)(sig64 + lVar8);
    *puVar2 = *puVar1 & uVar6;
    puVar2[1] = uVar10 & uVar6;
    puVar2[2] = uVar9 & uVar6;
    puVar2[3] = uVar3 & uVar6;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x40);
  return local_214;
}

Assistant:

static int secp256k1_schnorrsig_sign_internal(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg, msglen, seckey, pk_buf, bip340_algo, sizeof(bip340_algo), ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    memset(seckey, 0, sizeof(seckey));

    return ret;
}